

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# natpmp.cpp
# Opt level: O0

void __thiscall
libtorrent::natpmp::natpmp
          (natpmp *this,io_context *ios,portmap_callback *cb,listen_socket_handle *ls)

{
  listen_socket_handle *ls_local;
  portmap_callback *cb_local;
  io_context *ios_local;
  natpmp *this_local;
  
  ::std::enable_shared_from_this<libtorrent::natpmp>::enable_shared_from_this
            (&this->super_enable_shared_from_this<libtorrent::natpmp>);
  this->m_callback = cb;
  this->m_version = version_pcp;
  libtorrent::aux::
  container_wrapper<libtorrent::natpmp::mapping_t,_libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>_>
  ::container_wrapper(&this->m_mappings);
  boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::basic_endpoint(&this->m_nat_endpoint);
  libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>::strong_typedef
            (&this->m_currently_mapping,-1);
  this->m_retry_count = 0;
  boost::asio::ip::address::address(&this->m_external_ip);
  boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::basic_endpoint(&this->m_remote);
  libtorrent::aux::
  noexcept_move_only<boost::asio::basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
  ::noexcept_move_only<boost::asio::io_context>
            ((noexcept_move_only<boost::asio::basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
              *)&this->m_socket,ios,(type *)0x0);
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_waitable_timer<boost::asio::io_context>(&this->m_send_timer,ios,(type *)0x0);
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_waitable_timer<boost::asio::io_context>(&this->m_refresh_timer,ios,(type *)0x0);
  libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>::strong_typedef
            (&this->m_next_refresh,-1);
  this->m_ioc = ios;
  libtorrent::aux::listen_socket_handle::listen_socket_handle(&this->m_listen_handle,ls);
  this->m_disabled = false;
  this->m_abort = false;
  libtorrent::aux::
  container_wrapper<libtorrent::natpmp::mapping_t,libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>,std::vector<libtorrent::natpmp::mapping_t,std::allocator<libtorrent::natpmp::mapping_t>>>
  ::reserve<int,void>((container_wrapper<libtorrent::natpmp::mapping_t,libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>,std::vector<libtorrent::natpmp::mapping_t,std::allocator<libtorrent::natpmp::mapping_t>>>
                       *)&this->m_mappings,10);
  return;
}

Assistant:

natpmp::natpmp(io_context& ios
	, aux::portmap_callback& cb
	, listen_socket_handle ls)
	: m_callback(cb)
	, m_socket(ios)
	, m_send_timer(ios)
	, m_refresh_timer(ios)
	, m_ioc(ios)
	, m_listen_handle(std::move(ls))
{
	// unfortunately async operations rely on the storage
	// for this array not to be reallocated, by passing
	// around pointers to its elements. so reserve size for now
	m_mappings.reserve(10);
}